

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialect_detection.cpp
# Opt level: O0

NewLineIdentifier duckdb::CSVSniffer::DetectNewLineDelimiter(CSVBufferManager *buffer_manager)

{
  bool bVar1;
  bool bVar2;
  char *pcVar3;
  CSVBufferHandle *pCVar4;
  idx_t i;
  bool n;
  bool carriage_return;
  char *buffer_ptr;
  shared_ptr<duckdb::CSVBufferHandle,_true> buffer;
  shared_ptr<duckdb::CSVBufferHandle,_true> *in_stack_ffffffffffffff90;
  shared_ptr<duckdb::CSVBufferHandle,_true> *psVar5;
  shared_ptr<duckdb::CSVBufferHandle,_true> *local_40;
  NewLineIdentifier local_1;
  
  CSVBufferManager::GetBuffer
            ((CSVBufferManager *)
             buffer.internal.super___shared_ptr<duckdb::CSVBufferHandle,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,(idx_t)buffer_ptr);
  shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(in_stack_ffffffffffffff90);
  pcVar3 = CSVBufferHandle::Ptr((CSVBufferHandle *)0x177279c);
  bVar1 = false;
  bVar2 = false;
  local_40 = (shared_ptr<duckdb::CSVBufferHandle,_true> *)0x0;
  do {
    psVar5 = local_40;
    pCVar4 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(local_40);
    if ((shared_ptr<duckdb::CSVBufferHandle,_true> *)pCVar4->actual_size <= psVar5) {
LAB_0177285e:
      if ((bVar1) && (bVar2)) {
        local_1 = CARRY_ON;
      }
      else if (bVar1) {
        local_1 = SINGLE_R;
      }
      else {
        local_1 = SINGLE_N;
      }
      shared_ptr<duckdb::CSVBufferHandle,_true>::~shared_ptr
                ((shared_ptr<duckdb::CSVBufferHandle,_true> *)0x17728a8);
      return local_1;
    }
    if (pcVar3[(long)local_40] == '\r') {
      bVar1 = true;
    }
    else {
      if (pcVar3[(long)local_40] == '\n') {
        bVar2 = true;
        goto LAB_0177285e;
      }
      if (bVar1) goto LAB_0177285e;
    }
    local_40 = (shared_ptr<duckdb::CSVBufferHandle,_true> *)
               ((long)&(local_40->internal).
                       super___shared_ptr<duckdb::CSVBufferHandle,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr + 1);
  } while( true );
}

Assistant:

NewLineIdentifier CSVSniffer::DetectNewLineDelimiter(CSVBufferManager &buffer_manager) {
	// Get first buffer
	auto buffer = buffer_manager.GetBuffer(0);
	auto buffer_ptr = buffer->Ptr();
	bool carriage_return = false;
	bool n = false;
	for (idx_t i = 0; i < buffer->actual_size; i++) {
		if (buffer_ptr[i] == '\r') {
			carriage_return = true;
		} else if (buffer_ptr[i] == '\n') {
			n = true;
			break;
		} else if (carriage_return) {
			break;
		}
	}
	if (carriage_return && n) {
		return NewLineIdentifier::CARRY_ON;
	}
	if (carriage_return) {
		return NewLineIdentifier::SINGLE_R;
	}
	return NewLineIdentifier::SINGLE_N;
}